

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O0

void __thiscall rcdiscover::Discover::Discover(Discover *this)

{
  bool bVar1;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  *in_RDI;
  SocketLinux *socket;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  uint16_t in_stack_0000019e;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *this_00;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  local_18 [3];
  
  SocketLinux::createAndBindForAllInterfaces(in_stack_0000019e);
  this_00 = (vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
            (in_RDI + 3);
  std::
  vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  ::vector((vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
            *)0x11d76f);
  local_18[0]._M_current =
       (SocketLinux *)
       std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::begin
                 (this_00);
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                               *)this_00);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator*(local_18);
    Socket<rcdiscover::SocketLinux>::enableBroadcast((Socket<rcdiscover::SocketLinux> *)0x11d7c5);
    Socket<rcdiscover::SocketLinux>::enableNonBlocking((Socket<rcdiscover::SocketLinux> *)0x11d7d1);
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

Discover::Discover() :
  sockets_(SocketType::createAndBindForAllInterfaces(3956))
{
  for (auto &socket : sockets_)
  {
    socket.enableBroadcast();
    socket.enableNonBlocking();
  }
}